

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::UnaryOp_x86_avx::forward_inplace(UnaryOp_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  ulong uVar8;
  Option *extraout_RDX;
  Option *extraout_RDX_00;
  Option *extraout_RDX_01;
  Option *extraout_RDX_02;
  Option *extraout_RDX_03;
  Option *extraout_RDX_04;
  ulong uVar9;
  Option *extraout_RDX_05;
  Option *extraout_RDX_06;
  Option *extraout_RDX_07;
  undefined1 (*pauVar10) [32];
  int iVar11;
  long lVar12;
  float *pfVar13;
  int iVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [32];
  __m256 afVar17;
  undefined1 auVar28 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 in_XMM12 [16];
  __m128 afVar48;
  unary_op_tanh op;
  unary_op_tanh local_a9;
  ulong local_a8;
  size_t local_a0;
  size_t local_98;
  ulong local_90;
  Mat *local_88;
  __m256 local_80 [2];
  
  local_88 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86_avx[-3])) {
  case 0:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar3 * uVar9 * sVar2 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar18 = *pauVar10;
        auVar36._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
        auVar36._8_4_ = auVar18._8_4_ ^ 0x80000000;
        auVar36._12_4_ = auVar18._12_4_ ^ 0x80000000;
        auVar36._16_4_ = auVar18._16_4_ ^ 0x80000000;
        auVar36._20_4_ = auVar18._20_4_ ^ 0x80000000;
        auVar36._24_4_ = auVar18._24_4_ ^ 0x80000000;
        auVar36._28_4_ = auVar18._28_4_ ^ 0x80000000;
        auVar18 = vmaxps_avx(auVar36,auVar18);
        *pauVar10 = auVar18;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar30 = vandps_avx(auVar29,*(undefined1 (*) [16])*pauVar10);
        *(undefined1 (*) [16])*pauVar10 = auVar30;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar3 * sVar2 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        auVar30 = vandps_avx(ZEXT416(*(uint *)((long)pvVar1 + lVar12 * 4 + lVar7)),auVar29);
        *(int *)((long)pvVar1 + lVar12 * 4 + lVar7) = auVar30._0_4_;
      }
    }
    break;
  case 1:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar3 * uVar9 * sVar2 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar18 = *pauVar10;
        auVar32._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
        auVar32._8_4_ = auVar18._8_4_ ^ 0x80000000;
        auVar32._12_4_ = auVar18._12_4_ ^ 0x80000000;
        auVar32._16_4_ = auVar18._16_4_ ^ 0x80000000;
        auVar32._20_4_ = auVar18._20_4_ ^ 0x80000000;
        auVar32._24_4_ = auVar18._24_4_ ^ 0x80000000;
        auVar32._28_4_ = auVar18._28_4_ ^ 0x80000000;
        *pauVar10 = auVar32;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar30 = *(undefined1 (*) [16])*pauVar10;
        auVar31._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
        auVar31._8_4_ = auVar30._8_4_ ^ 0x80000000;
        auVar31._12_4_ = auVar30._12_4_ ^ 0x80000000;
        *(undefined1 (*) [16])*pauVar10 = auVar31;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar3 * sVar2 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        *(uint *)((long)pvVar1 + lVar12 * 4 + lVar7) =
             *(uint *)((long)pvVar1 + lVar12 * 4 + lVar7) ^ 0x80000000;
      }
    }
    break;
  case 2:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar3 * uVar9 * sVar2 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar18 = vroundps_avx(*pauVar10,1);
        *pauVar10 = auVar18;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar30 = vroundps_avx(*(undefined1 (*) [16])*pauVar10,1);
        *(undefined1 (*) [16])*pauVar10 = auVar30;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar3 * sVar2 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        auVar30 = vroundss_avx(in_ZMM1._0_16_,ZEXT416(*(uint *)((long)pvVar1 + lVar12 * 4 + lVar7)),
                               9);
        *(int *)((long)pvVar1 + lVar12 * 4 + lVar7) = auVar30._0_4_;
      }
    }
    break;
  case 3:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar3 * uVar9 * sVar2 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar18 = vroundps_avx(*pauVar10,2);
        *pauVar10 = auVar18;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar30 = vroundps_avx(*(undefined1 (*) [16])*pauVar10,2);
        *(undefined1 (*) [16])*pauVar10 = auVar30;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar3 * sVar2 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        auVar30 = vroundss_avx(in_ZMM1._0_16_,ZEXT416(*(uint *)((long)pvVar1 + lVar12 * 4 + lVar7)),
                               10);
        *(int *)((long)pvVar1 + lVar12 * 4 + lVar7) = auVar30._0_4_;
      }
    }
    break;
  case 4:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar3 * uVar9 * sVar2 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar5._4_4_ = *(float *)(*pauVar10 + 4) * *(float *)(*pauVar10 + 4);
        auVar5._0_4_ = *(float *)*pauVar10 * *(float *)*pauVar10;
        auVar5._8_4_ = *(float *)(*pauVar10 + 8) * *(float *)(*pauVar10 + 8);
        auVar5._12_4_ = *(float *)(*pauVar10 + 0xc) * *(float *)(*pauVar10 + 0xc);
        auVar5._16_4_ = *(float *)(*pauVar10 + 0x10) * *(float *)(*pauVar10 + 0x10);
        auVar5._20_4_ = *(float *)(*pauVar10 + 0x14) * *(float *)(*pauVar10 + 0x14);
        auVar5._24_4_ = *(float *)(*pauVar10 + 0x18) * *(float *)(*pauVar10 + 0x18);
        auVar5._28_4_ = *(undefined4 *)(*pauVar10 + 0x1c);
        *pauVar10 = auVar5;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar16._0_4_ = *(float *)*pauVar10 * *(float *)*pauVar10;
        auVar16._4_4_ = *(float *)(*pauVar10 + 4) * *(float *)(*pauVar10 + 4);
        auVar16._8_4_ = *(float *)(*pauVar10 + 8) * *(float *)(*pauVar10 + 8);
        auVar16._12_4_ = *(float *)(*pauVar10 + 0xc) * *(float *)(*pauVar10 + 0xc);
        *(undefined1 (*) [16])*pauVar10 = auVar16;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar3 * sVar2 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = *(float *)((long)pvVar1 + lVar12 * 4 + lVar7);
        *(float *)((long)pvVar1 + lVar12 * 4 + lVar7) = fVar15 * fVar15;
      }
    }
    break;
  case 5:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    auVar33._8_4_ = 0x7fffffff;
    auVar33._0_8_ = 0x7fffffff7fffffff;
    auVar33._12_4_ = 0x7fffffff;
    auVar33._16_4_ = 0x7fffffff;
    auVar33._20_4_ = 0x7fffffff;
    auVar33._24_4_ = 0x7fffffff;
    auVar33._28_4_ = 0x7fffffff;
    auVar38._8_4_ = 0x800000;
    auVar38._0_8_ = 0x80000000800000;
    auVar38._12_4_ = 0x800000;
    auVar38._16_4_ = 0x800000;
    auVar38._20_4_ = 0x800000;
    auVar38._24_4_ = 0x800000;
    auVar38._28_4_ = 0x800000;
    auVar39._8_4_ = 0x7fffffff;
    auVar39._0_8_ = 0x7fffffff7fffffff;
    auVar39._12_4_ = 0x7fffffff;
    auVar40._8_4_ = 0x800000;
    auVar40._0_8_ = 0x80000000800000;
    auVar40._12_4_ = 0x800000;
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar3 * uVar9 * sVar2 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar18 = *pauVar10;
        auVar4 = vrsqrtps_avx(auVar18);
        fVar15 = auVar18._0_4_ * auVar4._0_4_;
        fVar42 = auVar18._4_4_ * auVar4._4_4_;
        fVar43 = auVar18._8_4_ * auVar4._8_4_;
        fVar44 = auVar18._12_4_ * auVar4._12_4_;
        fVar45 = auVar18._16_4_ * auVar4._16_4_;
        fVar46 = auVar18._20_4_ * auVar4._20_4_;
        fVar47 = auVar18._24_4_ * auVar4._24_4_;
        auVar6._4_4_ = fVar42 * -0.5 * (fVar42 * auVar4._4_4_ + -3.0);
        auVar6._0_4_ = fVar15 * -0.5 * (fVar15 * auVar4._0_4_ + -3.0);
        auVar6._8_4_ = fVar43 * -0.5 * (fVar43 * auVar4._8_4_ + -3.0);
        auVar6._12_4_ = fVar44 * -0.5 * (fVar44 * auVar4._12_4_ + -3.0);
        auVar6._16_4_ = fVar45 * -0.5 * (fVar45 * auVar4._16_4_ + -3.0);
        auVar6._20_4_ = fVar46 * -0.5 * (fVar46 * auVar4._20_4_ + -3.0);
        auVar6._24_4_ = fVar47 * -0.5 * (fVar47 * auVar4._24_4_ + -3.0);
        auVar6._28_4_ = auVar4._28_4_ + -3.0;
        auVar18 = vandps_avx(auVar18,auVar33);
        auVar18 = vcmpps_avx(auVar38,auVar18,2);
        auVar18 = vandps_avx(auVar18,auVar6);
        *pauVar10 = auVar18;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar30 = *(undefined1 (*) [16])*pauVar10;
        auVar35 = vrsqrtps_avx(auVar30);
        fVar15 = auVar30._0_4_ * auVar35._0_4_;
        fVar42 = auVar30._4_4_ * auVar35._4_4_;
        fVar43 = auVar30._8_4_ * auVar35._8_4_;
        fVar44 = auVar30._12_4_ * auVar35._12_4_;
        auVar41._0_4_ = fVar15 * -0.5 * (fVar15 * auVar35._0_4_ + -3.0);
        auVar41._4_4_ = fVar42 * -0.5 * (fVar42 * auVar35._4_4_ + -3.0);
        auVar41._8_4_ = fVar43 * -0.5 * (fVar43 * auVar35._8_4_ + -3.0);
        auVar41._12_4_ = fVar44 * -0.5 * (fVar44 * auVar35._12_4_ + -3.0);
        auVar30 = vandps_avx(auVar30,auVar39);
        auVar30 = vcmpps_avx(auVar40,auVar30,2);
        auVar30 = vandps_avx(auVar30,auVar41);
        *(undefined1 (*) [16])*pauVar10 = auVar30;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar3 * sVar2 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        auVar30 = vsqrtss_avx(in_XMM12,ZEXT416(*(uint *)((long)pvVar1 + lVar12 * 4 + lVar7)));
        *(int *)((long)pvVar1 + lVar12 * 4 + lVar7) = auVar30._0_4_;
      }
    }
    break;
  case 6:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar3 * uVar9 * sVar2 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar18 = vrsqrtps_avx(*pauVar10);
        *pauVar10 = auVar18;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar30 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar10);
        *(undefined1 (*) [16])*pauVar10 = auVar30;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar3 * sVar2 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = *(float *)((long)pvVar1 + lVar12 * 4 + lVar7);
        auVar30 = vrsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
        fVar42 = auVar30._0_4_;
        *(float *)((long)pvVar1 + lVar12 * 4 + lVar7) =
             fVar42 * -0.5 * (fVar15 * fVar42 * fVar42 + -3.0);
      }
    }
    break;
  case 7:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar17 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_exp::func_pack8((unary_op_exp *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar17;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; bottom_top_blob = local_88, uVar8 = local_90, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar28 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar48 = UnaryOp_x86_avx_functor::unary_op_exp::func_pack4
                            ((unary_op_exp *)&local_a9,(__m128 *)local_80);
        auVar24._0_8_ = afVar48._0_8_;
        auVar24._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar13 = auVar24._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_98 * local_a0 * local_90;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = expf(*(float *)((long)pvVar1 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar1 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_90 = uVar8 + 1;
    }
    break;
  case 8:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar17 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_log::func_pack8((unary_op_log *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar17;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; bottom_top_blob = local_88, uVar8 = local_90, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar28 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar48 = UnaryOp_x86_avx_functor::unary_op_log::func_pack4
                            ((unary_op_log *)&local_a9,(__m128 *)local_80);
        auVar27._0_8_ = afVar48._0_8_;
        auVar27._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar13 = auVar27._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_98 * local_a0 * local_90;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = logf(*(float *)((long)pvVar1 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar1 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_90 = uVar8 + 1;
    }
    break;
  case 9:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar17 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_sin::func_pack8((unary_op_sin *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar17;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; bottom_top_blob = local_88, uVar8 = local_90, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar28 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar48 = UnaryOp_x86_avx_functor::unary_op_sin::func_pack4
                            ((unary_op_sin *)&local_a9,(__m128 *)local_80);
        auVar23._0_8_ = afVar48._0_8_;
        auVar23._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar13 = auVar23._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_98 * local_a0 * local_90;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = sinf(*(float *)((long)pvVar1 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar1 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_90 = uVar8 + 1;
    }
    break;
  case 10:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar17 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_cos::func_pack8((unary_op_cos *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar17;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; bottom_top_blob = local_88, uVar8 = local_90, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar28 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar48 = UnaryOp_x86_avx_functor::unary_op_cos::func_pack4
                            ((unary_op_cos *)&local_a9,(__m128 *)local_80);
        auVar26._0_8_ = afVar48._0_8_;
        auVar26._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar13 = auVar26._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_98 * local_a0 * local_90;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = cosf(*(float *)((long)pvVar1 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar1 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_90 = uVar8 + 1;
    }
    break;
  case 0xb:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar17 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_tan::func_pack8((unary_op_tan *)&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar17;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; bottom_top_blob = local_88, uVar8 = local_90, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar28 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar48 = UnaryOp_x86_avx_functor::unary_op_tan::func_pack4
                            ((unary_op_tan *)&local_a9,(__m128 *)local_80);
        auVar21._0_8_ = afVar48._0_8_;
        auVar21._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar13 = auVar21._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_98 * local_a0 * local_90;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = tanf(*(float *)((long)pvVar1 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar1 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_90 = uVar8 + 1;
    }
    break;
  case 0xc:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar17 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_asin::func_pack8
                  ((__m256 *)&local_a9,(unary_op_asin *)local_80,(__m256 *)opt);
        *(__m256 *)pfVar13 = afVar17;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
        opt = extraout_RDX_02;
      }
      for (; bottom_top_blob = local_88, uVar8 = local_90, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar28 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar48 = UnaryOp_x86_avx_functor::unary_op_asin::func_pack4
                            ((unary_op_asin *)&local_a9,(__m128 *)local_80);
        auVar22._0_8_ = afVar48._0_8_;
        auVar22._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar13 = auVar22._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
        opt = extraout_RDX_03;
      }
      lVar7 = local_98 * local_a0 * local_90;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = asinf(*(float *)((long)pvVar1 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar1 + lVar12 * 4 + lVar7) = fVar15;
        opt = extraout_RDX_04;
      }
      local_90 = uVar8 + 1;
    }
    break;
  case 0xd:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar17 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_acos::func_pack8
                  ((__m256 *)&local_a9,(unary_op_acos *)local_80,(__m256 *)opt);
        *(__m256 *)pfVar13 = afVar17;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
        opt = extraout_RDX_05;
      }
      for (; bottom_top_blob = local_88, uVar8 = local_90, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar28 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar48 = UnaryOp_x86_avx_functor::unary_op_acos::func_pack4
                            ((unary_op_acos *)&local_a9,(__m128 *)local_80);
        auVar25._0_8_ = afVar48._0_8_;
        auVar25._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar13 = auVar25._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
        opt = extraout_RDX_06;
      }
      lVar7 = local_98 * local_a0 * local_90;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = acosf(*(float *)((long)pvVar1 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar1 + lVar12 * 4 + lVar7) = fVar15;
        opt = extraout_RDX_07;
      }
      local_90 = uVar8 + 1;
    }
    break;
  case 0xe:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar17 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_atan::func_pack8
                  ((__m256 *)&local_a9,(unary_op_atan *)local_80,(__m256 *)opt);
        *(__m256 *)pfVar13 = afVar17;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
        opt = extraout_RDX;
      }
      for (; bottom_top_blob = local_88, uVar8 = local_90, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar28 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar48 = UnaryOp_x86_avx_functor::unary_op_atan::func_pack4
                            ((unary_op_atan *)&local_a9,(__m128 *)local_80);
        auVar20._0_8_ = afVar48._0_8_;
        auVar20._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar13 = auVar20._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
        opt = extraout_RDX_00;
      }
      lVar7 = local_98 * local_a0 * local_90;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = atanf(*(float *)((long)pvVar1 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar1 + lVar12 * 4 + lVar7) = fVar15;
        opt = extraout_RDX_01;
      }
      local_90 = uVar8 + 1;
    }
    break;
  case 0xf:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar9 = 0;
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar9;
    }
    auVar18._8_4_ = 0x3f800000;
    auVar18._0_8_ = 0x3f8000003f800000;
    auVar18._12_4_ = 0x3f800000;
    auVar18._16_4_ = 0x3f800000;
    auVar18._20_4_ = 0x3f800000;
    auVar18._24_4_ = 0x3f800000;
    auVar18._28_4_ = 0x3f800000;
    auVar30._8_4_ = 0x3f800000;
    auVar30._0_8_ = 0x3f8000003f800000;
    auVar30._12_4_ = 0x3f800000;
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar10 = (undefined1 (*) [32])(sVar3 * uVar9 * sVar2 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar33 = *pauVar10;
        auVar38 = vrcpps_avx(auVar33);
        fVar15 = auVar38._0_4_;
        fVar42 = auVar38._4_4_;
        auVar4._4_4_ = auVar33._4_4_ * fVar42;
        auVar4._0_4_ = auVar33._0_4_ * fVar15;
        fVar43 = auVar38._8_4_;
        auVar4._8_4_ = auVar33._8_4_ * fVar43;
        fVar44 = auVar38._12_4_;
        auVar4._12_4_ = auVar33._12_4_ * fVar44;
        fVar45 = auVar38._16_4_;
        auVar4._16_4_ = auVar33._16_4_ * fVar45;
        fVar46 = auVar38._20_4_;
        auVar4._20_4_ = auVar33._20_4_ * fVar46;
        fVar47 = auVar38._24_4_;
        auVar4._24_4_ = auVar33._24_4_ * fVar47;
        auVar4._28_4_ = auVar33._28_4_;
        auVar33 = vsubps_avx(auVar18,auVar4);
        auVar37._0_4_ = fVar15 + fVar15 * auVar33._0_4_;
        auVar37._4_4_ = fVar42 + fVar42 * auVar33._4_4_;
        auVar37._8_4_ = fVar43 + fVar43 * auVar33._8_4_;
        auVar37._12_4_ = fVar44 + fVar44 * auVar33._12_4_;
        auVar37._16_4_ = fVar45 + fVar45 * auVar33._16_4_;
        auVar37._20_4_ = fVar46 + fVar46 * auVar33._20_4_;
        auVar37._24_4_ = fVar47 + fVar47 * auVar33._24_4_;
        auVar37._28_4_ = auVar38._28_4_ + auVar33._28_4_;
        *pauVar10 = auVar37;
        pauVar10 = pauVar10 + 1;
        lVar12 = lVar12 + 8;
      }
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar39 = *(undefined1 (*) [16])*pauVar10;
        auVar35 = vrcpps_avx(auVar39);
        fVar15 = auVar35._0_4_;
        auVar34._0_4_ = auVar39._0_4_ * fVar15;
        fVar42 = auVar35._4_4_;
        auVar34._4_4_ = auVar39._4_4_ * fVar42;
        fVar43 = auVar35._8_4_;
        auVar34._8_4_ = auVar39._8_4_ * fVar43;
        fVar44 = auVar35._12_4_;
        auVar34._12_4_ = auVar39._12_4_ * fVar44;
        auVar39 = vsubps_avx(auVar30,auVar34);
        auVar35._0_4_ = fVar15 + fVar15 * auVar39._0_4_;
        auVar35._4_4_ = fVar42 + fVar42 * auVar39._4_4_;
        auVar35._8_4_ = fVar43 + fVar43 * auVar39._8_4_;
        auVar35._12_4_ = fVar44 + fVar44 * auVar39._12_4_;
        *(undefined1 (*) [16])*pauVar10 = auVar35;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        lVar12 = lVar12 + 4;
      }
      lVar7 = sVar3 * sVar2 * uVar9;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        *(float *)((long)pvVar1 + lVar12 * 4 + lVar7) =
             1.0 / *(float *)((long)pvVar1 + lVar12 * 4 + lVar7);
      }
    }
    break;
  case 0x10:
    iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar13 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        local_80[0] = *(__m256 *)pfVar13;
        afVar17 = local_80[0];
        UnaryOp_x86_avx_functor::unary_op_tanh::func_pack8(&local_a9,local_80);
        *(__m256 *)pfVar13 = afVar17;
        pfVar13 = pfVar13 + 8;
        lVar12 = lVar12 + 8;
      }
      for (; bottom_top_blob = local_88, uVar8 = local_90, iVar14 + 3 < iVar11; iVar14 = iVar14 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar13;
        auVar28 = ZEXT856(*(ulong *)(pfVar13 + 2));
        afVar48 = UnaryOp_x86_avx_functor::unary_op_tanh::func_pack4(&local_a9,(__m128 *)local_80);
        auVar19._0_8_ = afVar48._0_8_;
        auVar19._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar13 = auVar19._0_16_;
        pfVar13 = pfVar13 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = local_98 * local_a0 * local_90;
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar15 = tanhf(*(float *)((long)pvVar1 + lVar12 * 4 + lVar7));
        *(float *)((long)pvVar1 + lVar12 * 4 + lVar7) = fVar15;
      }
      local_90 = uVar8 + 1;
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_avx_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    return 0;
}